

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

_Bool pmu_counter_enabled(CPUARMState_conflict *env,uint8_t counter)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t *puVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  uVar1 = env->features;
  if ((uVar1 & 0x200000000) == 0) {
    bVar12 = false;
  }
  else {
    if (env->aarch64 == 0) {
      bVar12 = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar12 = (~env->pstate & 0xc) == 0;
    }
    if (!bVar12) {
      bVar12 = ((env->cp15).scr_el3 & 1) == 0;
    }
  }
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar9 = env->uncached_cpsr & 0x1f;
      if (uVar9 == 0x10) {
        uVar9 = 0;
      }
      else if (uVar9 == 0x16) {
        uVar9 = 3;
      }
      else if (uVar9 == 0x1a) {
        uVar9 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          bVar11 = uVar9 == 0x16;
          if (!bVar11) {
            bVar11 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if ((((uint)uVar1 >> 0x1c & 1) == 0) && (uVar9 = 3, bVar11)) goto LAB_0061e40b;
        }
        uVar9 = 1;
      }
    }
    else {
      uVar9 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar9 = 1;
    if ((env->v7m).exception == 0) {
      uVar9 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061e40b:
  if ((uVar1 >> 0x23 & 1) == 0) {
    bVar7 = 0;
    goto LAB_0061e63e;
  }
  uVar2 = (env->cp15).mdcr_el2;
  uVar8 = (uint)uVar2;
  if (((uVar1 >> 0x20 & 1) == 0) ||
     (bVar7 = (byte)uVar2, counter == '\x1f' || counter < (bVar7 & 0x1f))) {
    bVar7 = (byte)(env->cp15).c9_pmcr;
  }
  else {
    bVar7 = bVar7 >> 7;
  }
  if ((bVar7 & 1) == 0) {
    bVar11 = false;
  }
  else {
    bVar11 = ((env->cp15).c9_pmcnten >> ((ulong)counter & 0x3f) & 1) != 0;
  }
  if (bVar12 == false) {
    if ((uVar9 == 2) && ((counter == '\x1f' || ((uint)counter < (uVar8 & 7))))) goto LAB_0061e4ba;
LAB_0061e4d6:
    uVar8 = 0;
  }
  else {
    if ((uVar1 & 0x200000000) == 0) goto LAB_0061e4d6;
    uVar8 = (uint)(env->cp15).mdcr_el3;
LAB_0061e4ba:
    uVar8 = uVar8 >> 0x11;
  }
  bVar6 = (byte)uVar8;
  if ((counter == '\x1f') && ((uVar8 & 1) != 0)) {
    bVar6 = (byte)(env->cp15).c9_pmcr >> 5;
  }
  puVar4 = (env->cp15).c14_pmevtyper + counter;
  if (counter == '\x1f') {
    puVar4 = &(env->cp15).pmccfiltr_el0;
  }
  uVar3 = *puVar4;
  bVar13 = (uVar1 & 0x200000000) != 0;
  uVar10 = uVar1 >> 0x1c & 0xffffffff;
  if (bVar13) {
    uVar10 = 0;
  }
  uVar8 = (uint)uVar3;
  if ((~uVar1 & 0x210000000) == 0) {
    uVar10 = (ulong)((uint)(env->cp15).scr_el3 >> 10);
  }
  bVar7 = (byte)uVar10;
  if (((uVar1 >> 0x20 & 1) != 0) &&
     (((uVar1 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
    if ((uVar10 & 1) == 0) {
      bVar7 = 0;
    }
    else {
      bVar7 = (byte)((env->cp15).hcr_el2 >> 0x1f);
    }
  }
  if (uVar9 == 2) {
    bVar5 = (uVar1 >> 0x20 & 1) == 0 || (uVar8 >> 0x1b & 1) == 0;
  }
  else if (uVar9 == 1) {
    bVar5 = (bool)(~bVar12 & (uVar1 & 0x200000000) != 0 & (byte)(uVar3 >> 0x1d) & 1 ^ (int)uVar8 < 0
                  );
  }
  else if (uVar9 == 0) {
    bVar5 = (uVar3 & 0x40000000) != 0;
    if (bVar12 == false) {
      bVar5 = (uVar8 & 0x40000000) >> 0x1e != (uint)(bVar13 & (byte)(uVar3 >> 0x1c) & 1);
    }
  }
  else {
    bVar5 = (bool)((byte)(uVar3 >> 0x1a) & 1 & (uVar1 & 0x200000000) != 0 & bVar7 ^ (int)uVar8 < 0);
  }
  if (counter == '\x1f') {
    if (!bVar11) {
      bVar7 = 0;
      goto LAB_0061e63e;
    }
  }
  else {
    bVar12 = true;
    if ((ushort)uVar3 < 0x3d) {
      bVar12 = supported_event_map[uVar8 & 0x3f] == 0xffff;
    }
    bVar7 = 0;
    if ((bVar12) || (!bVar11)) goto LAB_0061e63e;
  }
  bVar7 = (bVar6 | bVar5) ^ 1;
LAB_0061e63e:
  return (_Bool)(bVar7 & 1);
}

Assistant:

static bool pmu_counter_enabled(CPUARMState *env, uint8_t counter)
{
    uint64_t filter;
    bool e, p, u, nsk, nsu, nsh, m;
    bool enabled, prohibited, filtered;
    bool secure = arm_is_secure(env);
    int el = arm_current_el(env);
    uint8_t hpmn = env->cp15.mdcr_el2 & MDCR_HPMN;

    if (!arm_feature(env, ARM_FEATURE_PMU)) {
        return false;
    }

    if (!arm_feature(env, ARM_FEATURE_EL2) ||
            (counter < hpmn || counter == 31)) {
        e = env->cp15.c9_pmcr & PMCRE;
    } else {
        e = env->cp15.mdcr_el2 & MDCR_HPME;
    }
    enabled = e && (env->cp15.c9_pmcnten & (1ULL << counter));

    if (!secure) {
        if (el == 2 && (counter < (hpmn & 0x7) || counter == 31)) {
            prohibited = env->cp15.mdcr_el2 & MDCR_HPMD;
        } else {
            prohibited = false;
        }
    } else {
        prohibited = arm_feature(env, ARM_FEATURE_EL3) &&
           (env->cp15.mdcr_el3 & MDCR_SPME);
    }

    if (prohibited && counter == 31) {
        prohibited = env->cp15.c9_pmcr & PMCRDP;
    }

    if (counter == 31) {
        filter = env->cp15.pmccfiltr_el0;
    } else {
        filter = env->cp15.c14_pmevtyper[counter];
    }

    p   = filter & PMXEVTYPER_P;
    u   = filter & PMXEVTYPER_U;
    nsk = arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_NSK);
    nsu = arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_NSU);
    nsh = arm_feature(env, ARM_FEATURE_EL2) && (filter & PMXEVTYPER_NSH);
    m   = arm_el_is_aa64(env, 1) &&
              arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_M);

    if (el == 0) {
        filtered = secure ? u : u != nsu;
    } else if (el == 1) {
        filtered = secure ? p : p != nsk;
    } else if (el == 2) {
        filtered = !nsh;
    } else { /* EL3 */
        filtered = m != p;
    }

    if (counter != 31) {
        /*
         * If not checking PMCCNTR, ensure the counter is setup to an event we
         * support
         */
        uint16_t event = filter & PMXEVTYPER_EVTCOUNT;
        if (!event_supported(event)) {
            return false;
        }
    }

    return enabled && !prohibited && !filtered;
}